

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxInputManager.cpp
# Opt level: O3

void __thiscall OIS::LinuxInputManager::freeDeviceList_abi_cxx11_(LinuxInputManager *this)

{
  long in_RSI;
  
  freeDeviceList_abi_cxx11_((DeviceList *)this,(LinuxInputManager *)(in_RSI + -0xa0));
  return;
}

Assistant:

DeviceList LinuxInputManager::freeDeviceList()
{
	DeviceList ret;

	if(window)
	{
		if(keyboardUsed == false)
			ret.insert(std::make_pair(OISKeyboard, mInputSystemName));

		if(mouseUsed == false)
			ret.insert(std::make_pair(OISMouse, mInputSystemName));
	}

	for(JoyStickInfoList::iterator i = unusedJoyStickList.begin(); i != unusedJoyStickList.end(); ++i)
		ret.insert(std::make_pair(OISJoyStick, i->vendor));

	return ret;
}